

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.cc
# Opt level: O0

void __thiscall brown::MySimulator::hardwareLoop(MySimulator *this)

{
  long lVar1;
  int64_t iVar2;
  long *plVar3;
  long local_48;
  long local_40;
  int64_t dt;
  int64_t ty;
  int64_t tx;
  bool yr;
  MySimulator *pMStack_10;
  bool xr;
  MySimulator *this_local;
  
  pMStack_10 = this;
  tx._7_1_ = Timer::running(this->timx);
  tx._6_1_ = Timer::running(this->timy);
  if (((tx._7_1_ & 1) != 0) || ((bool)tx._6_1_)) {
    iVar2 = Timer::t(this->timx);
    ty = iVar2 - this->cx;
    iVar2 = Timer::t(this->timy);
    dt = iVar2 - this->cy;
    if (((tx._7_1_ & 1) == 0) || ((tx._6_1_ & 1) == 0)) {
      local_48 = dt;
      if ((tx._7_1_ & 1) != 0) {
        local_48 = ty;
      }
      local_40 = local_48;
    }
    else {
      plVar3 = std::min<long>(&ty,&dt);
      local_40 = *plVar3;
    }
    if ((tx._7_1_ & 1) != 0) {
      this->cx = local_40 + this->cx;
    }
    if ((tx._6_1_ & 1) != 0) {
      this->cy = local_40 + this->cy;
    }
    this->clk = local_40 + this->clk;
    if (((tx._7_1_ & 1) != 0) && (lVar1 = this->cx, iVar2 = Timer::t(this->timx), iVar2 <= lVar1)) {
      Simulator::setpin(&this->super_Simulator,this->clk,true,false,(bool)(this->dirx & 1),
                        (bool)(this->diry & 1),(bool)(this->isDown & 1));
      Timer::callback(this->timx,&this->super_Simulator);
      this->cx = 0;
    }
    if (((tx._6_1_ & 1) != 0) && (lVar1 = this->cy, iVar2 = Timer::t(this->timy), iVar2 <= lVar1)) {
      Simulator::setpin(&this->super_Simulator,this->clk,false,true,(bool)(this->dirx & 1),
                        (bool)(this->diry & 1),(bool)(this->isDown & 1));
      Timer::callback(this->timy,&this->super_Simulator);
      this->cy = 0;
    }
  }
  return;
}

Assistant:

void MySimulator::hardwareLoop() {
    bool xr = timx.running();
    bool yr = timy.running();
    if (!xr && !yr) {return;}
    std::int64_t tx = static_cast<std::int64_t>(timx.t()) - cx;
    std::int64_t ty = static_cast<std::int64_t>(timy.t()) - cy;
    std::int64_t dt = (xr && yr) ? std::min(tx, ty) : (xr ? tx : ty);
    if (xr) {cx += dt;}
    if (yr) {cy += dt;}
    clk += dt;

    if (xr && (cx >= timx.t())) {
        setpin(clk, true, false, dirx, diry, isDown);
        timx.callback(*this);
        cx = 0;
    }
    if (yr && (cy >= timy.t())) {
        setpin(clk, false, true, dirx, diry, isDown);
        timy.callback(*this);
        cy = 0;
    }
}